

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adsc.c
# Opt level: O1

void la_adsc_intermediate_projection_format_text
               (la_adsc_formatter_ctx_t *ctx,char *label,void *data)

{
  uint uVar1;
  char *pcVar2;
  
  la_vstring_append_sprintf(ctx->vstr,"%*s%s:\n",(ulong)(uint)ctx->indent,"",label);
  uVar1 = ctx->indent + 1;
  ctx->indent = uVar1;
  la_vstring_append_sprintf(ctx->vstr,"%*sDistance: %.3f nm\n",*data,(ulong)uVar1,"");
  pcVar2 = " (invalid)";
  if (*(char *)((long)data + 0x18) == '\0') {
    pcVar2 = "";
  }
  la_vstring_append_sprintf
            (ctx->vstr,"%*sTrue track: %.1f deg%s\n",*(undefined8 *)((long)data + 8),
             (ulong)(uint)ctx->indent,"",pcVar2);
  la_vstring_append_sprintf
            (ctx->vstr,"%*sAlt: %d ft\n",(ulong)(uint)ctx->indent,"",
             (ulong)*(uint *)((long)data + 0x10));
  la_vstring_append_sprintf
            (ctx->vstr,"%*sETA: %d sec\n",(ulong)(uint)ctx->indent,"",
             (ulong)*(uint *)((long)data + 0x14));
  ctx->indent = ctx->indent + -1;
  return;
}

Assistant:

LA_ADSC_FORMATTER_FUN(la_adsc_intermediate_projection_format_text) {
	la_adsc_intermediate_projection_t const *p = data;
	LA_ISPRINTF(ctx->vstr, ctx->indent, "%s:\n", label);
	ctx->indent++;
	LA_ISPRINTF(ctx->vstr, ctx->indent, "Distance: %.3f nm\n", p->distance);
	LA_ISPRINTF(ctx->vstr, ctx->indent, "True track: %.1f deg%s\n", p->track, p->track_invalid ? " (invalid)" : "");
	LA_ISPRINTF(ctx->vstr, ctx->indent, "Alt: %d ft\n", p->alt);
	LA_ISPRINTF(ctx->vstr, ctx->indent, "ETA: %d sec\n", p->eta);
	ctx->indent--;
}